

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv__getiovmax(void)

{
  return 0x400;
}

Assistant:

int uv__getiovmax(void) {
#if defined(IOV_MAX)
  return IOV_MAX;
#elif defined(_SC_IOV_MAX)
  static int iovmax_cached = -1;
  int iovmax;

  iovmax = uv__load_relaxed(&iovmax_cached);
  if (iovmax != -1)
    return iovmax;

  /* On some embedded devices (arm-linux-uclibc based ip camera),
   * sysconf(_SC_IOV_MAX) can not get the correct value. The return
   * value is -1 and the errno is EINPROGRESS. Degrade the value to 1.
   */
  iovmax = sysconf(_SC_IOV_MAX);
  if (iovmax == -1)
    iovmax = 1;

  uv__store_relaxed(&iovmax_cached, iovmax);

  return iovmax;
#else
  return 1024;
#endif
}